

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_get_properties(ATTACH_HANDLE attach,fields *properties_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  ATTACH_INSTANCE *attach_instance;
  uint32_t item_count;
  int result;
  fields *properties_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x148c;
  }
  else {
    _item_count = properties_value;
    properties_value_local = &attach->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,(uint32_t *)&attach_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)attach_instance < 0xe) {
        attach_instance._4_4_ = 0x149a;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(attach->composite_value,0xd);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          attach_instance._4_4_ = 0x14a2;
        }
        else {
          iVar1 = amqpvalue_get_map(value,_item_count);
          if (iVar1 == 0) {
            attach_instance._4_4_ = 0;
          }
          else {
            attach_instance._4_4_ = 0x14a9;
          }
        }
      }
    }
    else {
      attach_instance._4_4_ = 0x1494;
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_get_properties(ATTACH_HANDLE attach, fields* properties_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 13)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 13);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_fields(item_value, properties_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}